

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O2

char * xname2(obj *obj,boolean ignore_oquan)

{
  objclass *poVar1;
  char cVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  int iVar6;
  objclass *poVar7;
  short sVar8;
  boolean bVar9;
  int iVar10;
  fruit *pfVar11;
  size_t sVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  long lVar16;
  char *__s;
  fruit **ppfVar17;
  fruit *__src;
  char *pcVar18;
  long lVar19;
  byte bVar20;
  uint uVar21;
  byte bVar22;
  ulong uVar23;
  long lVar24;
  fruit *__src_00;
  bool bVar25;
  long lStack_a0;
  byte local_60;
  
  sVar8 = urole.malenum;
  poVar7 = objects;
  cVar2 = (char)program_state.gameover;
  uVar3 = obj->otyp;
  uVar23 = (ulong)(short)uVar3;
  poVar1 = objects + uVar23;
  uVar5 = *(uint *)&obj->field_0x4a;
  bVar25 = true;
  if ((objects[uVar23].field_0x10 & 1) == 0) {
    bVar25 = false;
    if (((uVar5 >> 0xd & 1) != 0) && (bVar25 = false, 2 < (ushort)(uVar3 - 0xda))) {
      bVar25 = true;
      if ((viz_array[obj->oy][obj->ox] & 2U) == 0) {
        if (u.ux == obj->ox) {
          bVar25 = u.uy == obj->oy;
        }
        else {
          bVar25 = false;
        }
      }
    }
  }
  __src = (fruit *)obj_descr[poVar1->oc_name_idx].oc_name;
  __src_00 = (fruit *)obj_descr[poVar1->oc_descr_idx].oc_descr;
  pcVar15 = poVar1->oc_uname;
  nextobuf_bufidx = (nextobuf_bufidx + 1) % 0xc;
  lVar24 = (long)nextobuf_bufidx * 0x100;
  __s = nextobuf_bufs + lVar24 + 0x50;
  if ((urole.malenum == 0x165) &&
     (pfVar11 = (fruit *)Japanese_item_name((int)(short)uVar3), pfVar11 != (fruit *)0x0)) {
    __src = pfVar11;
  }
  bVar22 = (byte)uVar5 >> 4 & 1;
  *__s = '\0';
  if ((!bVar25) && ((~poVar1->field_0x10 & 0x44) == 0)) {
    bVar22 = 0;
  }
  bVar20 = (byte)uVar5 >> 5 & 1;
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001f3ee7;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001f3ee2;
LAB_001f3f0d:
    bVar20 = 1;
  }
  else {
LAB_001f3ee2:
    if (ublindf != (obj *)0x0) {
LAB_001f3ee7:
      if (ublindf->oartifact == '\x1d') goto LAB_001f3f0d;
    }
  }
  uVar21 = *(uint *)&obj->field_0x4a & 0x2000;
  local_60 = bVar20;
  if ((uVar21 != 0) && (local_60 = 1, (ushort)(obj->otyp - 0xdaU) < 3)) {
    local_60 = bVar20;
  }
  bVar9 = obj_is_pname(obj);
  if (bVar9 != '\0') goto LAB_001f4dfc;
  if ((cVar2 == '\0' && (int)obj->oprops_known < 0) && ((obj->oprops & ~obj->oprops_known) != 0)) {
    sVar12 = strlen(__s);
    builtin_strncpy(nextobuf_bufs + sVar12 + lVar24 + 0x50,"magical ",8);
    *(undefined1 *)(lVar24 + 0x329848 + sVar12) = 0;
    uVar21 = *(uint *)&obj->field_0x4a & 0x2000;
  }
  if ((((uVar21 != 0) && ((obj->otyp & 0xfffeU) != 0xda)) && (obj->otyp != 0xdc)) &&
     ((fruit *)pcVar15 == (fruit *)0x0)) {
    sVar12 = strlen(__s);
    builtin_strncpy(nextobuf_bufs + sVar12 + lVar24 + 0x50,"priz",4);
    *(undefined4 *)(lVar24 + 0x329843 + sVar12) = 0x20657a;
  }
  pfVar11 = (fruit *)pcVar15;
  switch(obj->oclass) {
  case '\x02':
    if (((byte)(poVar7[obj->otyp].oc_subtyp + 0x1aU) < 5) && ((obj->field_0x4b & 0x80) != 0)) {
      sVar12 = strlen(__s);
      builtin_strncpy(nextobuf_bufs + sVar12 + lVar24 + 0x50,"poisoned",8);
      *(undefined2 *)(lVar24 + 0x329848 + sVar12) = 0x20;
    }
  case '\x06':
  case '\x11':
    if (uVar3 == 0xed) {
      sVar12 = strlen(__s);
      builtin_strncpy(nextobuf_bufs + sVar12 + lVar24 + 0x50,"pair of ",8);
      *(undefined1 *)(lVar24 + 0x329848 + sVar12) = 0;
    }
    if (local_60 == 0) {
      if (__src_00 != (fruit *)0x0) {
        __src = __src_00;
      }
      strcat(__s,__src->fname);
    }
    else {
      if (((obj->oprops & 4) != 0) &&
         (uVar23 = obj->oprops_known, (byte)((byte)(((uint)uVar23 & 4) >> 2) | cVar2 != '\0') == 1))
      {
        sVar12 = strlen(__s);
        if ((uVar23 & 4) == 0) {
          builtin_strncpy(nextobuf_bufs + sVar12 + lVar24 + 0x50,"[thirsty] ",0xb);
        }
        else {
          builtin_strncpy(nextobuf_bufs + sVar12 + lVar24 + 0x50,"thirsty ",9);
        }
      }
      if (((obj->oprops & 8) != 0) &&
         (uVar23 = obj->oprops_known, (byte)((byte)(((uint)uVar23 & 8) >> 3) | cVar2 != '\0') == 1))
      {
        sVar12 = strlen(__s);
        if ((uVar23 & 8) == 0) {
          builtin_strncpy(nextobuf_bufs + sVar12 + lVar24 + 0x50,"[vorpal] ",10);
        }
        else {
          builtin_strncpy(nextobuf_bufs + sVar12 + lVar24 + 0x50,"vorpal ",8);
        }
      }
      if (bVar25) {
LAB_001f4890:
        strcat(__s,__src->fname);
      }
      else {
        if (((((fruit *)pcVar15 != (fruit *)0x0) || ((obj->field_0x4b & 0x20) == 0)) ||
            ((ushort)(obj->otyp - 0xdaU) < 3)) || (obj->oclass == '\x02')) {
          if (__src_00 != (fruit *)0x0) {
            __src = __src_00;
          }
          goto LAB_001f4890;
        }
        sVar12 = strlen(__s);
        builtin_strncpy(nextobuf_bufs + sVar12 + lVar24 + 0x50,"tool",4);
        *(undefined1 *)(lVar24 + 0x329844 + sVar12) = 0;
      }
      lVar19 = obj->oprops;
      lVar16 = obj->oprops_known;
      pcVar14 = __s;
      if (uVar3 == 0xed) {
        pcVar14 = strstr(__s,"pair of ");
        pcVar14 = pcVar14 + 8;
      }
      pcVar14 = strstr(pcVar14," of ");
      propnames(__s,lVar19,lVar16,'\x01',pcVar14 != (char *)0x0);
      if (bVar25 == false && (fruit *)pcVar15 != (fruit *)0x0) {
        pcVar14 = eos(__s);
        sprintf(pcVar14," called %s",pcVar15);
      }
    }
    if (uVar3 == 0xf6) {
      pcVar14 = eos(__s);
      pcVar15 = mons_mname(mons + obj->corpsenm);
      pcVar15 = strchr("aeiouAEIOU",(int)*pcVar15);
      __src_00 = (fruit *)0x29c07b;
      if (pcVar15 == (char *)0x0) {
        __src_00 = (fruit *)0x29398c;
      }
      pcVar15 = mons_mname(mons + obj->corpsenm);
      pcVar18 = " of a%s %s";
LAB_001f4993:
      sprintf(pcVar14,pcVar18,__src_00,pcVar15);
    }
    break;
  case '\x03':
    if ((ushort)(uVar3 - 0x5f) < 0xb) {
      sVar12 = strlen(__s);
      builtin_strncpy(nextobuf_bufs + sVar12 + lVar24 + 0x50,"set of ",8);
      if (obj->oclass == '\x03') goto LAB_001f435d;
    }
    else {
LAB_001f435d:
      if ((byte)(poVar7[obj->otyp].oc_subtyp - 3U) < 2) {
        sVar12 = strlen(__s);
        builtin_strncpy(nextobuf_bufs + sVar12 + lVar24 + 0x50,"pair of ",8);
        *(undefined1 *)(lVar24 + 0x329848 + sVar12) = 0;
      }
    }
    if (((local_60 != 0) && ((obj->oprops & 0x40) != 0)) &&
       (uVar23 = obj->oprops_known, (byte)((byte)(((uint)uVar23 & 0x40) >> 6) | cVar2 != '\0') == 1)
       ) {
      sVar12 = strlen(__s);
      if ((uVar23 & 0x40) == 0) {
        builtin_strncpy(nextobuf_bufs + sVar12 + lVar24 + 0x50,"[oilskin] ",0xb);
      }
      else {
        builtin_strncpy(nextobuf_bufs + sVar12 + lVar24 + 0x50,"oilskin ",9);
      }
    }
    uVar4 = obj->otyp;
    if ((long)(short)uVar4 < 0x89) {
LAB_001f4d5f:
      if (!bVar25) {
        if (((fruit *)pcVar15 != (fruit *)0x0) ||
           (((*(uint *)&obj->field_0x4a >> 0xd & 1) != 0 && (2 < (ushort)(uVar4 - 0xda))))) {
          if (obj->oclass == '\x03') {
            switch(poVar7[(short)uVar4].oc_subtyp) {
            case '\x01':
              sVar12 = strlen(__s);
              builtin_strncpy(nextobuf_bufs + sVar12 + lVar24 + 0x50,"shie",4);
              *(undefined4 *)(lVar24 + 0x329843 + sVar12) = 0x646c65;
              break;
            case '\x02':
              sVar12 = strlen(__s);
              builtin_strncpy(nextobuf_bufs + sVar12 + lVar24 + 0x50,"helm",4);
              *(undefined4 *)(lVar24 + 0x329843 + sVar12) = 0x74656d;
              break;
            case '\x03':
              sVar12 = strlen(__s);
              builtin_strncpy(nextobuf_bufs + sVar12 + lVar24 + 0x50,"glov",4);
              *(undefined4 *)(lVar24 + 0x329843 + sVar12) = 0x736576;
              break;
            case '\x04':
              sVar12 = strlen(__s);
              builtin_strncpy(nextobuf_bufs + sVar12 + lVar24 + 0x50,"boot",4);
              *(undefined2 *)(lVar24 + 0x329844 + sVar12) = 0x73;
              break;
            case '\x05':
              sVar12 = strlen(__s);
              builtin_strncpy(nextobuf_bufs + sVar12 + lVar24 + 0x50,"cloa",4);
              *(undefined2 *)(lVar24 + 0x329844 + sVar12) = 0x6b;
              break;
            default:
              goto switchD_001f4e92_default;
            }
          }
          else {
switchD_001f4e92_default:
            sVar12 = strlen(__s);
            builtin_strncpy(nextobuf_bufs + sVar12 + lVar24 + 0x50,"armo",4);
            *(undefined2 *)(lVar24 + 0x329844 + sVar12) = 0x72;
          }
          if ((fruit *)pcVar15 != (fruit *)0x0) {
            propnames(__s,obj->oprops,obj->oprops_known,'\0','\0');
            sVar12 = strlen(__s);
            builtin_strncpy(nextobuf_bufs + sVar12 + lVar24 + 0x50," called ",8);
            *(undefined1 *)(lVar24 + 0x329848 + sVar12) = 0;
            goto LAB_001f4517;
          }
          break;
        }
        strcat(__s,(char *)__src_00);
        lVar19 = obj->oprops;
        lVar16 = obj->oprops_known;
        if ((ushort)(uVar3 - 0x5f) < 0xb) {
          lStack_a0 = 7;
          pcVar15 = "set of ";
LAB_001f4f40:
          pcVar15 = strstr(__s,pcVar15);
          pcVar15 = pcVar15 + lStack_a0;
        }
        else {
          pcVar15 = __s;
          if ((obj->oclass == '\x03') && ((byte)(poVar7[obj->otyp].oc_subtyp - 3U) < 2)) {
            lStack_a0 = 8;
            pcVar15 = "pair of ";
            goto LAB_001f4f40;
          }
        }
        pcVar15 = strstr(pcVar15," of ");
        propnames(__s,lVar19,lVar16,'\0',pcVar15 != (char *)0x0);
        break;
      }
      strcat(__s,__src->fname);
      lVar19 = obj->oprops;
      lVar16 = obj->oprops_known;
      pcVar15 = strstr(__src->fname," of ");
      bVar25 = pcVar15 != (char *)0x0;
    }
    else {
      if ((uVar4 < 0x8c) && (local_60 == 0)) {
        *(undefined4 *)(nextobuf_bufs + lVar24 + 0x53) = 0x646c65;
        builtin_strncpy(nextobuf_bufs + lVar24 + 0x50,"shie",4);
      }
      else {
        if ((uVar4 != 0x8e) || (local_60 != 0)) goto LAB_001f4d5f;
        *(undefined8 *)(nextobuf_bufs + lVar24 + 0x56) = 0x646c6569687320;
        builtin_strncpy(nextobuf_bufs + lVar24 + 0x50,"smooth s",8);
      }
      lVar19 = obj->oprops;
      lVar16 = obj->oprops_known;
      bVar25 = false;
    }
    propnames(__s,lVar19,lVar16,'\0',bVar25);
    break;
  case '\x04':
    if (local_60 == 0) {
      sVar12 = strlen(__s);
      builtin_strncpy(nextobuf_bufs + sVar12 + lVar24 + 0x50,"ring",4);
LAB_001f4b95:
      *(undefined1 *)(lVar24 + 0x329844 + sVar12) = 0;
    }
    else {
      if (bVar25) {
        pcVar14 = eos(__s);
        pcVar18 = "ring of %s";
        __src_00 = __src;
LAB_001f4aff:
        sprintf(pcVar14,pcVar18,__src_00);
      }
      else {
        if (((fruit *)pcVar15 == (fruit *)0x0) &&
           (((obj->field_0x4b & 0x20) == 0 || ((ushort)(obj->otyp - 0xdaU) < 3)))) {
          pcVar14 = eos(__s);
          pcVar18 = "%s ring";
          goto LAB_001f4aff;
        }
        sVar12 = strlen(__s);
        builtin_strncpy(nextobuf_bufs + sVar12 + lVar24 + 0x50,"ring",4);
        *(undefined1 *)(lVar24 + 0x329844 + sVar12) = 0;
      }
      propnames(__s,obj->oprops,obj->oprops_known,'\0',bVar25);
      if ((fruit *)pcVar15 != (fruit *)0x0 && bVar25 == false) {
LAB_001f4b33:
        pcVar14 = eos(__s);
        pcVar18 = " called %s";
        goto LAB_001f4b4a;
      }
    }
    break;
  case '\x05':
    if (local_60 == 0) {
      sVar12 = strlen(__s);
      builtin_strncpy(nextobuf_bufs + sVar12 + lVar24 + 0x50,"amul",4);
      *(undefined4 *)(lVar24 + 0x329843 + sVar12) = 0x74656c;
    }
    else {
      if ((uVar3 & 0xfffe) == 0xd8) {
        if (bVar22 == 0) {
          __src = __src_00;
        }
LAB_001f4709:
        strcat(__s,__src->fname);
      }
      else {
        if (bVar25) goto LAB_001f4709;
        if (((fruit *)pcVar15 == (fruit *)0x0) &&
           (((obj->field_0x4b & 0x20) == 0 || ((ushort)(obj->otyp - 0xdaU) < 3)))) {
          pcVar14 = eos(__s);
          sprintf(pcVar14,"%s amulet",__src_00);
        }
        else {
          sVar12 = strlen(__s);
          builtin_strncpy(nextobuf_bufs + sVar12 + lVar24 + 0x50,"amul",4);
          *(undefined4 *)(lVar24 + 0x329843 + sVar12) = 0x74656c;
        }
      }
      lVar19 = obj->oprops;
      lVar16 = obj->oprops_known;
      pcVar14 = strstr(__s," of ");
      propnames(__s,lVar19,lVar16,'\0',pcVar14 != (char *)0x0);
      if (!(bool)(bVar25 | (fruit *)pcVar15 == (fruit *)0x0)) goto LAB_001f4b33;
    }
    break;
  case '\a':
    if (uVar3 == 0x120) {
      bVar9 = piday();
      if (bVar9 == '\0') goto LAB_001f463c;
      sVar12 = strlen(__s);
      builtin_strncpy(nextobuf_bufs + sVar12 + lVar24 + 0x50,"irration",8);
      *(undefined8 *)(lVar24 + 0x329847 + sVar12) = 0x656970206c616e;
    }
    else if (uVar3 == 0x11e) {
      ppfVar17 = &ffruit;
      while (pfVar11 = *ppfVar17, pfVar11 != (fruit *)0x0) {
        iVar10 = pfVar11->fid;
        iVar6 = -iVar10;
        if (0 < iVar10) {
          iVar6 = iVar10;
        }
        if (iVar6 == obj->spe) goto LAB_001f4517;
        ppfVar17 = &pfVar11->nextf;
      }
      warning("Bad fruit #%d?",(ulong)(uint)(int)obj->spe);
    }
    else {
LAB_001f463c:
      strcat(__s,__src->fname);
      if ((uVar3 == 0x129) && (bVar22 != 0)) {
        if (obj->spe < '\x01') {
          uVar5 = obj->corpsenm;
          if ((long)(int)uVar5 != -1) {
            cVar2 = mons[(int)uVar5].mlet;
            if ((((cVar2 != '\x02') && (cVar2 != '\n')) && (cVar2 != '\x16')) && (cVar2 != '\x19'))
            {
              if (cVar2 == '7') {
                if ((uVar5 | 2) == 0x106) goto LAB_001f50d6;
              }
              else if (cVar2 != ' ') {
                if (cVar2 == '*') {
                  if (uVar5 != 0xd6) goto LAB_001f4caf;
                }
                else if ((cVar2 == '6') || ((cVar2 == '\x1f' && (uVar5 != 0x9e))))
                goto LAB_001f4caf;
LAB_001f50d6:
                pcVar14 = eos(__s);
                pcVar15 = mons_mname(mons + obj->corpsenm);
                pcVar18 = " of %s meat";
                goto LAB_001f4b4a;
              }
            }
LAB_001f4caf:
            pcVar14 = eos(__s);
            pcVar15 = mons_mname(mons + obj->corpsenm);
            pcVar18 = " of %s";
            goto LAB_001f4b4a;
          }
          sVar12 = strlen(__s);
          builtin_strncpy(nextobuf_bufs + sVar12 + lVar24 + 0x50,"empty ti",8);
          *(undefined2 *)(lVar24 + 0x329848 + sVar12) = 0x6e;
        }
        else {
          sVar12 = strlen(__s);
          builtin_strncpy(nextobuf_bufs + sVar12 + lVar24 + 0x50," of spin",8);
          *(undefined4 *)(lVar24 + 0x329848 + sVar12) = 0x686361;
        }
      }
    }
    break;
  case '\b':
    if ((local_60 != 0) && ((obj->field_0x4b & 3) != 0)) {
      sVar12 = strlen(__s);
      builtin_strncpy(nextobuf_bufs + sVar12 + lVar24 + 0x50,"diluted ",8);
      *(undefined1 *)(lVar24 + 0x329848 + sVar12) = 0;
    }
    if (((bVar25) || ((fruit *)pcVar15 != (fruit *)0x0)) || (local_60 == 0)) {
      sVar12 = strlen(__s);
      builtin_strncpy(nextobuf_bufs + sVar12 + lVar24 + 0x50,"poti",4);
      *(undefined4 *)(lVar24 + 0x329843 + sVar12) = 0x6e6f69;
      if (local_60 != 0) {
        sVar12 = strlen(__s);
        if (!bVar25) {
          builtin_strncpy(nextobuf_bufs + sVar12 + lVar24 + 0x50," called ",9);
          goto LAB_001f4517;
        }
        builtin_strncpy(nextobuf_bufs + sVar12 + lVar24 + 0x50," of ",5);
        if (((uVar3 == 0x14f) && (sVar8 == 0x161 || (char)((uVar5 & 0x40) >> 6) != '\0')) &&
           ((*(uint *)&obj->field_0x4a & 3) != 0)) {
          pcVar15 = "holy ";
          if ((*(uint *)&obj->field_0x4a & 2) == 0) {
            pcVar15 = "unholy ";
          }
          strcat(__s,pcVar15);
        }
        goto switchD_001f4013_caseD_c;
      }
    }
    else {
      if (((obj->field_0x4b & 0x20) == 0) || ((ushort)(obj->otyp - 0xdaU) < 3)) {
        strcat(__s,(char *)__src_00);
        sVar12 = strlen(__s);
        (__s + sVar12)[0] = ' ';
        (__s + sVar12)[1] = '\0';
      }
      sVar12 = strlen(__s);
      builtin_strncpy(nextobuf_bufs + sVar12 + lVar24 + 0x50,"poti",4);
      *(undefined4 *)(lVar24 + 0x329843 + sVar12) = 0x6e6f69;
    }
    break;
  case '\t':
    if (local_60 != 0) {
      if (!bVar25) {
        if ((fruit *)pcVar15 == (fruit *)0x0) {
          if (((obj->field_0x4b & 0x20) != 0) && (2 < (ushort)(obj->otyp - 0xdaU)))
          goto LAB_001f4c2e;
          if ((poVar1->field_0x10 & 0x10) == 0) {
            strcat(__s,(char *)__src_00);
            sVar12 = strlen(__s);
            builtin_strncpy(nextobuf_bufs + sVar12 + lVar24 + 0x50," scroll",8);
            break;
          }
          sVar12 = strlen(__s);
          builtin_strncpy(nextobuf_bufs + sVar12 + lVar24 + 0x50,"scroll labeled ",0x10);
          pfVar11 = __src_00;
        }
        else {
          sVar12 = strlen(__s);
          builtin_strncpy(nextobuf_bufs + sVar12 + lVar24 + 0x50,"scroll c",8);
          *(undefined8 *)(lVar24 + 0x329847 + sVar12) = 0x2064656c6c6163;
        }
        goto LAB_001f4517;
      }
      sVar12 = strlen(__s);
      builtin_strncpy(nextobuf_bufs + sVar12 + lVar24 + 0x50,"scroll o",8);
      *(undefined4 *)(lVar24 + 0x329847 + sVar12) = 0x20666f;
      goto switchD_001f4013_caseD_c;
    }
LAB_001f4c2e:
    sVar12 = strlen(__s);
    builtin_strncpy(nextobuf_bufs + sVar12 + lVar24 + 0x50,"scro",4);
    *(undefined4 *)(lVar24 + 0x329843 + sVar12) = 0x6c6c6f;
    break;
  case '\n':
    if (local_60 != 0) {
      if (bVar25) {
        if (uVar3 != 0x1bd) {
          sVar12 = strlen(__s);
          builtin_strncpy(nextobuf_bufs + sVar12 + lVar24 + 0x50,"spellboo",8);
          *(undefined8 *)(lVar24 + 0x329846 + sVar12) = 0x20666f206b6f6f;
        }
        goto switchD_001f4013_caseD_c;
      }
      if ((fruit *)pcVar15 == (fruit *)0x0) {
        if (((obj->field_0x4b & 0x20) != 0) && (2 < (ushort)(obj->otyp - 0xdaU))) goto LAB_001f4aa8;
        pcVar14 = eos(__s);
        pcVar18 = "%s spellbook";
        pcVar15 = (char *)__src_00;
      }
      else {
        pcVar14 = eos(__s);
        pcVar18 = "spellbook called %s";
      }
      goto LAB_001f4b4a;
    }
LAB_001f4aa8:
    sVar12 = strlen(__s);
    builtin_strncpy(nextobuf_bufs + sVar12 + lVar24 + 0x50,"spellboo",8);
    *(undefined2 *)(lVar24 + 0x329848 + sVar12) = 0x6b;
    break;
  case '\v':
    if (local_60 == 0) {
LAB_001f4b86:
      sVar12 = strlen(__s);
      builtin_strncpy(nextobuf_bufs + sVar12 + lVar24 + 0x50,"wand",4);
      goto LAB_001f4b95;
    }
    if (bVar25) {
      pcVar14 = eos(__s);
      pcVar18 = "wand of %s";
      pcVar15 = __src->fname;
    }
    else if ((fruit *)pcVar15 == (fruit *)0x0) {
      if (((obj->field_0x4b & 0x20) != 0) && (2 < (ushort)(obj->otyp - 0xdaU))) goto LAB_001f4b86;
      pcVar14 = eos(__s);
      pcVar18 = "%s wand";
      pcVar15 = (char *)__src_00;
    }
    else {
      pcVar14 = eos(__s);
      pcVar18 = "wand called %s";
    }
    goto LAB_001f4b4a;
  case '\f':
  case '\x10':
switchD_001f4013_caseD_c:
    pfVar11 = __src;
LAB_001f4517:
    strcat(__s,pfVar11->fname);
    break;
  case '\r':
    pfVar11 = (fruit *)0x29364a;
    if ((*(ushort *)&poVar1->field_0x11 & 0x1f0) == 0x150) {
      pfVar11 = (fruit *)0x28a200;
    }
    if (local_60 == 0) goto LAB_001f4517;
    if (bVar25) {
      strcat(__s,__src->fname);
      if ((uVar3 == 0x212) ||
         (((*(ushort *)&poVar7[uVar23].field_0x11 & 0x1f0) == 0x140 &&
          ((0xd < uVar3 - 0x1f0 || ((0x2077U >> (uVar3 - 0x1f0 & 0x1f) & 1) == 0)))))) {
        sVar12 = strlen(__s);
        builtin_strncpy(nextobuf_bufs + sVar12 + lVar24 + 0x50," sto",4);
        *(undefined4 *)(lVar24 + 0x329843 + sVar12) = 0x656e6f;
      }
      break;
    }
    if ((fruit *)pcVar15 == (fruit *)0x0) {
      if (((obj->field_0x4b & 0x20) != 0) && (2 < (ushort)(obj->otyp - 0xdaU))) goto LAB_001f4517;
      pcVar14 = eos(__s);
      pcVar18 = "%s %s";
      pcVar15 = pfVar11->fname;
    }
    else {
      pcVar14 = eos(__s);
      pcVar18 = "%s called %s";
      __src_00 = pfVar11;
    }
    goto LAB_001f4993;
  case '\x0e':
    if (uVar3 != 0x215) goto switchD_001f4013_caseD_c;
    pcVar15 = eos(__s);
    pcVar14 = "";
    pcVar18 = "";
    if ((urole.malenum == 0x159) && (pcVar18 = "historic ", (obj->spe & 1U) == 0)) {
      pcVar18 = "";
    }
    lVar19 = (long)obj->corpsenm;
    if ((mons[lVar19].mflags2 & 0x80000) == 0) {
      if ((mons[lVar19].geno & 0x1000) == 0) {
        pcVar14 = mons_mname(mons + lVar19);
        pcVar13 = strchr("aeiouAEIOU",(int)*pcVar14);
        pcVar14 = "an ";
        if (pcVar13 == (char *)0x0) {
          pcVar14 = "a ";
        }
        lVar19 = (long)obj->corpsenm;
      }
      else {
        pcVar14 = "the ";
      }
    }
    pcVar13 = mons_mname(mons + lVar19);
    sprintf(pcVar15,"%s%s of %s%s",pcVar18,__src,pcVar14,pcVar13);
    break;
  case '\x0f':
    pcVar14 = eos(__s);
    pcVar15 = "";
    if ((uint)poVar1->oc_weight < obj->owt) {
      pcVar15 = "very ";
    }
    pcVar18 = "%sheavy iron ball";
LAB_001f4b4a:
    sprintf(pcVar14,pcVar18,pcVar15);
    break;
  default:
    sprintf(__s,"glorkum %d %d %d",(ulong)(uint)(int)obj->oclass,uVar23 & 0xffffffff,
            (ulong)(uint)(int)obj->spe);
  }
  if ((ignore_oquan == '\0') && (obj->quan != 1)) {
    pcVar15 = makeplural(__s);
    strcpy(__s,pcVar15);
  }
  if ((obj->onamelth != '\0') && (local_60 != 0)) {
    sVar12 = strlen(__s);
    builtin_strncpy(nextobuf_bufs + sVar12 + lVar24 + 0x50," named ",8);
LAB_001f4dfc:
    strcat(__s,(char *)((long)obj->oextra + (long)obj->oxlth));
  }
  iVar10 = strncasecmp(__s,"the ",4);
  pcVar15 = nextobuf_bufs + lVar24 + 0x54;
  if (iVar10 != 0) {
    pcVar15 = __s;
  }
  return pcVar15;
}

Assistant:

static char *xname2(const struct obj *obj, boolean ignore_oquan)
{
	char *buf;
	int typ = obj->otyp;
	struct objclass *ocl = &objects[typ];
	int nn = ocl->oc_name_known ||
		 /* only reveal level prizes when in sight */
		 (Is_prize(obj) &&
		  (cansee(obj->ox, obj->oy) ||
		   /* even reveal when Sokoban prize only felt */
		   (u.ux == obj->ox && u.uy == obj->oy)));
	const char *actualn = OBJ_NAME(*ocl);
	const char *dn = OBJ_DESCR(*ocl);
	const char *un = ocl->oc_uname;
	boolean known = obj->known;
	boolean dknown = obj->dknown;
	boolean bknown = obj->bknown;
	boolean dump_ID_flag = program_state.gameover;

	buf = nextobuf() + PREFIX;	/* leave room for "17 -3 " */
	if (Role_if (PM_SAMURAI) && Japanese_item_name(typ))
		actualn = Japanese_item_name(typ);

	buf[0] = '\0';
	
	/*
	 * clean up known when it's tied to oc_name_known, eg after AD_DRIN
	 * This is only required for unique objects since the article
	 * printed for the object is tied to the combination of the two
	 * and printing the wrong article gives away information.
	 */
	if (!nn && ocl->oc_uses_known && ocl->oc_unique) known = 0;
	if (!Blind) dknown = TRUE;
	/* needed, otherwise BoH only shows up as "bag" when blind */
	if (Is_prize(obj)) dknown = TRUE;
	if (Role_if (PM_PRIEST)) bknown = TRUE;
	if (obj_is_pname(obj))
	    goto nameit;

	/*
	 * Give "magical" prefix to objects with properties as long as not all of
	 * them are known.
	 */
	if ((obj->oprops_known & ITEM_MAGICAL) && !dump_ID_flag &&
	    (obj->oprops & ~obj->oprops_known))
	    strcat(buf, "magical ");

	/* prizes suppress description of objects detected/remembered from afar */
	if (Is_prize(obj) && !un)
	    strcat(buf, "prize ");

	switch (obj->oclass) {
	    case AMULET_CLASS:
		if (!dknown) {
		    strcat(buf, "amulet");
		} else {
		    if (typ == AMULET_OF_YENDOR ||
			typ == FAKE_AMULET_OF_YENDOR)
			/* each must be identified individually */
			strcat(buf, known ? actualn : dn);
		    else if (nn)
			strcat(buf, actualn);
		    else if (un || Is_prize(obj))
			strcat(buf, "amulet"); /* u-named after props */
		    else
			sprintf(eos(buf), "%s amulet", dn);

		    propnames(buf, obj->oprops, obj->oprops_known, FALSE,
			      !!strstr(buf, " of "));

		    if (!nn && un)
			sprintf(eos(buf), " called %s", un);
		}
		break;
	    case WEAPON_CLASS:
		if (is_poisonable(obj) && obj->opoisoned)
		    strcat(buf, "poisoned ");
		/* fall through */
	    case VENOM_CLASS:
	    case TOOL_CLASS:
		if (typ == LENSES)
		    strcat(buf, "pair of ");

		if (!dknown) {
		    strcat(buf, dn ? dn : actualn);
		} else {
		    if ((obj->oprops & ITEM_DRLI) &&
			((obj->oprops_known & ITEM_DRLI) || dump_ID_flag)) {
			if (obj->oprops_known & ITEM_DRLI)
			    strcat(buf, "thirsty ");
			else
			    strcat(buf, "[thirsty] ");
		    }
		    if ((obj->oprops & ITEM_VORPAL) &&
			((obj->oprops_known & ITEM_VORPAL) || dump_ID_flag)) {
			if (obj->oprops_known & ITEM_VORPAL)
			    strcat(buf, "vorpal ");
			else
			    strcat(buf, "[vorpal] ");
		    }

		    if (nn)
			strcat(buf, actualn);
		    else if (un)
			strcat(buf, dn ? dn : actualn); /* u-named after props */
		    else if (Is_prize(obj) && obj->oclass != WEAPON_CLASS)
			strcat(buf, "tool");
		    else
			strcat(buf, dn ? dn : actualn);

		    /* avoid "pair of lenses and fire" */
		    propnames(buf, obj->oprops, obj->oprops_known, TRUE,
			      !!strstr((typ == LENSES ?
					    strstr(buf, "pair of ") + 8 :
					    buf), " of "));

		    if (!nn && un)
			sprintf(eos(buf), " called %s", un);
		}
		/* If we use an() here we'd have to remember never to use */
		/* it whenever calling doname() or xname(). */
		if (typ == FIGURINE)
		    sprintf(eos(buf), " of a%s %s",
			strchr(vowels,*(mons_mname(&mons[obj->corpsenm]))) ? "n" : "",
			mons_mname(&mons[obj->corpsenm]));
		break;
	    case ARMOR_CLASS:
		if (Is_dragon_scales(typ)) strcat(buf, "set of ");
		if (is_boots(obj) || is_gloves(obj)) strcat(buf, "pair of ");

		if (dknown && (obj->oprops & ITEM_OILSKIN) &&
		    ((obj->oprops_known & ITEM_OILSKIN) || dump_ID_flag)) {
		    if (obj->oprops_known & ITEM_OILSKIN)
			strcat(buf, "oilskin ");
		    else
			strcat(buf, "[oilskin] ");
		}

		if (obj->otyp >= ELVEN_SHIELD && obj->otyp <= ORCISH_SHIELD
				&& !dknown) {
			strcpy(buf, "shield");
			propnames(buf, obj->oprops, obj->oprops_known, FALSE,
				  FALSE);
			break;
		}
		if (obj->otyp == SHIELD_OF_REFLECTION && !dknown) {
			strcpy(buf, "smooth shield");
			propnames(buf, obj->oprops, obj->oprops_known, FALSE,
				  FALSE);
			break;
		}

		if (nn) {
			strcat(buf, actualn);
			/* allow "pair of boots of fire resistance" */
			propnames(buf, obj->oprops, obj->oprops_known, FALSE,
				  !!strstr(actualn, " of "));
		} else if (un || Is_prize(obj)) {
			if (is_boots(obj))
				strcat(buf,"boots");
			else if (is_gloves(obj))
				strcat(buf,"gloves");
			else if (is_cloak(obj))
				strcat(buf,"cloak");
			else if (is_helmet(obj))
				strcat(buf,"helmet");
			else if (is_shield(obj))
				strcat(buf,"shield");
			else
				strcat(buf,"armor");
			if (un) {
				propnames(buf, obj->oprops, obj->oprops_known, FALSE,
					  FALSE);
				strcat(buf, " called ");
				strcat(buf, un);
			}
		} else {
			strcat(buf, dn);
			/* skip "set of"/"pair of" for proper wording of
			 * "set of draken scales of fire resistance" */
			propnames(buf, obj->oprops, obj->oprops_known, FALSE,
				  !!strstr((Is_dragon_scales(typ) ?
						strstr(buf, "set of ") + 7:
					    (is_boots(obj) || is_gloves(obj)) ?
						strstr(buf, "pair of ") + 8:
						buf), " of "));
		}
		break;
	    case FOOD_CLASS:
		if (typ == SLIME_MOLD) {
			struct fruit *f;

			for (f=ffruit; f; f = f->nextf) {
				/* Object naming may occur due to bones trimming,
				 * where fids may be negative. */
				if (abs(f->fid) == obj->spe) {
					strcat(buf, f->fname);
					break;
				}
			}
			if (!f) warning("Bad fruit #%d?", obj->spe);
			break;
		} else if (typ == CREAM_PIE && piday()) {
			strcat(buf, "irrational pie");
			break;
		}

		strcat(buf, actualn);
		if (typ == TIN && known) {
		    if (obj->spe > 0)
			strcat(buf, " of spinach");
		    else if (obj->corpsenm == NON_PM)
		        strcat(buf, "empty tin");
		    else if (vegetarian(&mons[obj->corpsenm]))
			sprintf(eos(buf), " of %s", mons_mname(&mons[obj->corpsenm]));
		    else
			sprintf(eos(buf), " of %s meat", mons_mname(&mons[obj->corpsenm]));
		}
		break;
	    case COIN_CLASS:
	    case CHAIN_CLASS:
		strcat(buf, actualn);
		break;
	    case ROCK_CLASS:
		if (typ == STATUE)
		    sprintf(eos(buf), "%s%s of %s%s",
			(Role_if (PM_ARCHEOLOGIST) && (obj->spe & STATUE_HISTORIC)) ? "historic " : "" ,
			actualn,
			type_is_pname(&mons[obj->corpsenm]) ? "" :
			  (mons[obj->corpsenm].geno & G_UNIQ) ? "the " :
			    (strchr(vowels,*(mons_mname(&mons[obj->corpsenm]))) ?
								"an " : "a "),
			mons_mname(&mons[obj->corpsenm]));
		else strcat(buf, actualn);
		break;
	    case BALL_CLASS:
		sprintf(eos(buf), "%sheavy iron ball",
			(obj->owt > ocl->oc_weight) ? "very " : "");
		break;
	    case POTION_CLASS:
		if (dknown && obj->odiluted)
			strcat(buf, "diluted ");
		if (nn || un || !dknown) {
			strcat(buf, "potion");
			if (!dknown) break;
			if (nn) {
			    strcat(buf, " of ");
			    if (typ == POT_WATER &&
				bknown && (obj->blessed || obj->cursed)) {
				strcat(buf, obj->blessed ? "holy " : "unholy ");
			    }
			    strcat(buf, actualn);
			} else {
				strcat(buf, " called ");
				strcat(buf, un);
			}
		} else {
			if (!Is_prize(obj)) {
			    strcat(buf, dn);
			    strcat(buf, " ");
			}
			strcat(buf, "potion");
		}
		break;
	case SCROLL_CLASS:
		if (!dknown) {
		    strcat(buf, "scroll");
		    break;
		}
		if (nn) {
			strcat(buf, "scroll of ");
			strcat(buf, actualn);
		} else if (un) {
			strcat(buf, "scroll called ");
			strcat(buf, un);
		} else if (Is_prize(obj)) {
			strcat(buf, "scroll");
		} else if (ocl->oc_magic) {
			strcat(buf, "scroll labeled ");
			strcat(buf, dn);
		} else {
			strcat(buf, dn);
			strcat(buf, " scroll");
		}
		break;
	case WAND_CLASS:
		if (!dknown)
			strcat(buf, "wand");
		else if (nn)
			sprintf(eos(buf), "wand of %s", actualn);
		else if (un)
			sprintf(eos(buf), "wand called %s", un);
		else if (Is_prize(obj))
			strcat(buf, "wand");
		else
			sprintf(eos(buf), "%s wand", dn);
		break;
	case SPBOOK_CLASS:
		if (!dknown) {
			strcat(buf, "spellbook");
		} else if (nn) {
			if (typ != SPE_BOOK_OF_THE_DEAD)
			    strcat(buf, "spellbook of ");
			strcat(buf, actualn);
		} else if (un) {
			sprintf(eos(buf), "spellbook called %s", un);
		} else if (Is_prize(obj)) {
			strcat(buf, "spellbook");
		} else {
			sprintf(eos(buf), "%s spellbook", dn);
		}
		break;
	case RING_CLASS:
		if (!dknown) {
		    strcat(buf, "ring");
		} else {
		    if (nn)
			sprintf(eos(buf), "ring of %s", actualn);
		    else if (un)
			strcat(buf, "ring"); /* u-named after props */
		    else if (Is_prize(obj))
			strcat(buf, "ring");
		    else
			sprintf(eos(buf), "%s ring", dn);

		    propnames(buf, obj->oprops, obj->oprops_known, FALSE, nn);

		    if (!nn && un)
			sprintf(eos(buf), " called %s", un);
		}
		break;
	case GEM_CLASS:
	    {
		const char *rock =
			    (ocl->oc_material == MINERAL) ? "stone" : "gem";
		if (!dknown) {
		    strcat(buf, rock);
		} else if (!nn) {
		    if (un) sprintf(eos(buf), "%s called %s", rock, un);
		    else if (Is_prize(obj)) strcat(buf, rock);
		    else sprintf(eos(buf), "%s %s", dn, rock);
		} else {
		    strcat(buf, actualn);
		    if (GemStone(typ)) strcat(buf, " stone");
		}
		break;
	    }
	default:
		sprintf(buf,"glorkum %d %d %d", obj->oclass, typ, obj->spe);
	}
	if (!ignore_oquan && obj->quan != 1L) strcpy(buf, makeplural(buf));

	if (obj->onamelth && dknown) {
		strcat(buf, " named ");
nameit:
		strcat(buf, ONAME(obj));
	}

	if (!strncmpi(buf, "the ", 4)) buf += 4;
	return buf;
}